

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesManager.cxx
# Opt level: O2

array<dap::Variable> * __thiscall
cmDebugger::cmDebuggerVariablesManager::HandleVariablesRequest
          (array<dap::Variable> *__return_storage_ptr__,cmDebuggerVariablesManager *this,
          VariablesRequest *request)

{
  iterator iVar1;
  int64_t local_18;
  
  local_18 = (request->variablesReference).val;
  iVar1 = std::
          _Hashtable<long,_std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_std::allocator<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<long,_std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_std::allocator<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_18);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::
    function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>
    ::operator()(__return_storage_ptr__,
                 (function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>
                  *)((long)iVar1.
                           super__Node_iterator_base<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false>
                           ._M_cur + 0x10),request);
  }
  return __return_storage_ptr__;
}

Assistant:

dap::array<dap::Variable> cmDebuggerVariablesManager::HandleVariablesRequest(
  dap::VariablesRequest const& request)
{
  auto it = VariablesHandlers.find(request.variablesReference);

  if (it != VariablesHandlers.end()) {
    return it->second(request);
  }

  return dap::array<dap::Variable>();
}